

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O1

int op_kill(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  size_t cursor_len;
  char local_a8 [24];
  undefined8 uStack_90;
  size_t local_28;
  
  local_28 = 0;
  pcVar2 = luaL_tolstring(L,1,&local_28);
  if (local_28 == 8) {
    local_a8[0x14] = 1;
    local_a8[0x15] = 0;
    local_a8[0x16] = 0;
    local_a8[0x17] = 0;
    local_a8[0x13] = 0;
    local_a8[0x12] = 0;
    local_a8[0x11] = 0;
    local_a8[0x10] = 0;
    local_a8[0xf] = 0;
    local_a8[0xe] = 0;
    local_a8[0xd] = 7;
    local_a8[0xc] = 0xd7;
    local_a8[0xb] = 0;
    local_a8[10] = 0;
    local_a8[9] = 0;
    local_a8[8] = 0;
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    uStack_90 = *(undefined8 *)pcVar2;
    local_a8[0] = ' ';
    local_a8[1] = 0;
    local_a8[2] = 0;
    local_a8[3] = 0;
    lua_pushlstring(L,local_a8,0x20);
    iVar1 = 1;
  }
  else {
    iVar1 = luaL_error(L,"Invalid cursor id");
  }
  return iVar1;
}

Assistant:

static int
op_kill(lua_State *L) {
	size_t cursor_len = 0;
	const char * cursor_id = luaL_tolstring(L, 1, &cursor_len);
	if (cursor_len != 8) {
		return luaL_error(L, "Invalid cursor id");
	}

	struct buffer buf;
	buffer_create(&buf);

	int len = reserve_length(&buf);
	write_int32(&buf, 0);
	write_int32(&buf, 0);
	write_int32(&buf, OP_KILL_CURSORS);

	write_int32(&buf, 0);
	write_int32(&buf, 1);
	write_bytes(&buf, cursor_id, 8);

	write_length(&buf, buf.size, len);

	lua_pushlstring(L, (const char *)buf.ptr, buf.size);
	buffer_destroy(&buf);

	return 1;
}